

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O2

bool jessilib::equalsi<char,char32_t>
               (basic_string_view<char,_std::char_traits<char>_> lhs,
               basic_string_view<char32_t,_std::char_traits<char32_t>_> rhs)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  char *extraout_RDX;
  char *pcVar5;
  char *pcVar6;
  jessilib *this;
  decode_result dVar7;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  
  pcVar2 = (char *)rhs._M_len;
  pcVar6 = lhs._M_str;
  this = (jessilib *)lhs._M_len;
  pcVar5 = (char *)0x0;
  pcVar3 = pcVar2;
  while( true ) {
    if ((this == (jessilib *)0x0) || (pcVar2 == pcVar5)) {
      return this == (jessilib *)0x0 && pcVar2 == pcVar5;
    }
    in_string._M_str = pcVar3;
    in_string._M_len = (size_t)pcVar6;
    dVar7 = decode_codepoint_utf8<char>(this,in_string);
    sVar4 = dVar7.units;
    if ((sVar4 == 0) || (bVar1 = equalsi(dVar7.codepoint,rhs._M_str[(long)pcVar5]), !bVar1)) break;
    pcVar6 = pcVar6 + sVar4;
    this = this + -sVar4;
    pcVar5 = pcVar5 + 1;
    pcVar3 = extraout_RDX;
  }
  return false;
}

Assistant:

bool equalsi(std::basic_string_view<LhsCharT> lhs, std::basic_string_view<RhsCharT> rhs) {
	// If lhs and rhs are the same type, compare their sizes and quickly return if not same
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (lhs.size() != rhs.size()) {
			return false;
		}
	}

	while (!lhs.empty() && !rhs.empty()) {
		auto lhs_front = decode_codepoint(lhs);
		auto rhs_front = decode_codepoint(rhs);

		if (lhs_front.units == 0
			|| rhs_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return false;
		}

		if (!equalsi(lhs_front.codepoint, rhs_front.codepoint)) {
			// Codepoints don't fold to same value
			return false;
		}

		// Codepoints are equal; trim off the fronts and continue
		lhs.remove_prefix(lhs_front.units);
		rhs.remove_prefix(rhs_front.units);
	}

	return lhs.empty() && rhs.empty();
}